

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall
Model::get_schoenberg_grad
          (Model *this,double **g,double label,double alpha,int contextId,int centerId,
          double current_lr)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  double __x;
  double dVar5;
  uint local_68;
  uint local_64;
  int d_3;
  int d_2;
  int d_1;
  int d;
  double *diff;
  double scalar_val;
  double e;
  double eta;
  double current_lr_local;
  int centerId_local;
  int contextId_local;
  double alpha_local;
  double label_local;
  double **g_local;
  Model *this_local;
  
  uVar2 = CONCAT44(0,this->dim_size);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (uVar2 == 0 || SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (undefined8 *)operator_new__(uVar3);
  *puVar4 = 0;
  memset(puVar4 + 1,0,uVar3 - 8);
  for (d_2 = 0; (uint)d_2 < this->dim_size; d_2 = d_2 + 1) {
    puVar4[d_2] = this->emb1[contextId][d_2] - this->emb0[centerId][d_2];
  }
  e = 0.0;
  for (d_3 = 0; (uint)d_3 < this->dim_size; d_3 = d_3 + 1) {
    e = (double)puVar4[d_3] * (double)puVar4[d_3] + e;
  }
  __x = 1.0 / (e + 1.0);
  dVar5 = pow(__x,alpha);
  for (local_64 = 0; local_64 < this->dim_size; local_64 = local_64 + 1) {
    (*g)[(int)local_64] =
         (label - dVar5) * 2.0 * alpha * dVar5 * __x * 2.0 * (double)puVar4[(int)local_64];
  }
  for (local_68 = 0; local_68 < this->dim_size; local_68 = local_68 + 1) {
    (*g)[(int)local_68] = -current_lr * (*g)[(int)local_68];
  }
  if (puVar4 != (undefined8 *)0x0) {
    operator_delete__(puVar4);
  }
  return;
}

Assistant:

void Model::get_schoenberg_grad(double *&g, double label, double alpha, int contextId, int centerId, double current_lr) {

    double eta, e, scalar_val;
    auto *diff = new double[this->dim_size]{0};


    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d]; // (x-y)

    eta = 0.0;
    for (int d = 0; d < this->dim_size; d++)
        eta += diff[d]*diff[d];
    eta = 1.0 + eta;
    eta = 1.0 / eta; // eta = (1 + (x-y)^2 ) ^ {-1}

    e = pow(eta, alpha); // ( 1 + (x-y) )^{-\alpha}
    scalar_val = 2.0 * ( label - e  ) * ( alpha * e * eta ) * ( 2.0 );
    for (int d = 0; d < this->dim_size; d++)
        g[d] =  scalar_val * ( diff[d] );

    for (int d = 0; d < this->dim_size; d++)
        g[d] = -current_lr * g[d]; // minus comes from the objective function, minimization


    delete [] diff;
}